

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.cpp
# Opt level: O1

char * arc::readline_fp(char *prompt,FILE *fp)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  size_t __size;
  void *__ptr;
  size_t sVar4;
  
  printf("%s",prompt);
  __size = 0x50;
  pvVar2 = malloc(0x50);
  if (pvVar2 != (void *)0x0) {
    sVar4 = 0;
    do {
      do {
        __ptr = pvVar2;
        iVar1 = fgetc((FILE *)fp);
        if ((iVar1 == -1) || (iVar1 == 10)) {
          if (sVar4 == 0 && iVar1 == -1) {
            free(__ptr);
            return (char *)0x0;
          }
          *(undefined1 *)((long)__ptr + sVar4) = 0;
          pcVar3 = (char *)realloc(__ptr,sVar4 + 1);
          return pcVar3;
        }
        *(char *)((long)__ptr + sVar4) = (char)iVar1;
        sVar4 = sVar4 + 1;
        pvVar2 = __ptr;
      } while (__size != sVar4);
      __size = __size * 2;
      pvVar2 = realloc(__ptr,__size);
    } while (pvVar2 != (void *)0x0);
    free(__ptr);
  }
  return (char *)0x0;
}

Assistant:

char* readline_fp(const char* prompt, FILE* fp) {
		size_t size = 80;
		/* The size is extended by the input with the value of the provisional */
		char* str;
		int ch;
		size_t len = 0;
		printf("%s", prompt);
		str = (char*)malloc(sizeof(char) * size); /* size is start size */
		if (!str) return NULL;
		while (EOF != (ch = fgetc(fp)) && ch != '\n') {
			str[len++] = ch;
			if (len == size) {
				char* p = (char*)realloc(str, sizeof(char) * (size *= 2));
				if (!p) {
					free(str);
					return NULL;
				}
				str = p;
			}
		}
		if (ch == EOF && len == 0) {
			free(str);
			return NULL;
		}
		str[len++] = '\0';

		return (char*)realloc(str, sizeof(char) * len);
	}